

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LiteralSubstitutionTree.hpp
# Opt level: O0

IterTraits<Lib::CoproductIter<Lib::VirtualIterator<Indexing::QueryRes<Lib::SmartPtr<Indexing::ResultSubstitution>,_Inferences::ALASCA::BinaryResolutionConf::Lhs>_>,_Lib::IterTraits<Lib::CoproductIter<Lib::VirtualIterator<Indexing::QueryRes<Lib::SmartPtr<Indexing::ResultSubstitution>,_Inferences::ALASCA::BinaryResolutionConf::Lhs>_>,_Lib::IterTraits<Lib::CatIterator<Lib::VirtualIterator<Indexing::QueryRes<Lib::SmartPtr<Indexing::ResultSubstitution>,_Inferences::ALASCA::BinaryResolutionConf::Lhs>_>,_Lib::IterTraits<Lib::VirtualIterator<Indexing::QueryRes<Lib::SmartPtr<Indexing::ResultSubstitution>,_Inferences::ALASCA::BinaryResolutionConf::Lhs>_>_>_>_>_>_>_>_>
* __thiscall
Indexing::LiteralSubstitutionTree<Inferences::ALASCA::BinaryResolutionConf::Lhs>::
getResultIterator<Indexing::SubstitutionTree<Inferences::ALASCA::BinaryResolutionConf::Lhs>::FastInstancesIterator>
          (LiteralSubstitutionTree<Inferences::ALASCA::BinaryResolutionConf::Lhs> *this,Literal *lit
          ,bool complementary,bool retrieveSubstitutions)

{
  byte bVar1;
  bool bVar2;
  undefined1 in_CL;
  undefined8 in_RDX;
  SubstitutionTree<Inferences::ALASCA::BinaryResolutionConf::Lhs> *in_RDI;
  byte in_R8B;
  anon_class_24_3_b2e875d6 iter;
  SubstitutionTree *tree;
  SubstitutionTree<Inferences::ALASCA::BinaryResolutionConf::Lhs> *this_00;
  SubstitutionTree *local_40;
  undefined8 local_38;
  byte local_30;
  bool in_stack_ffffffffffffffd7;
  Literal *in_stack_ffffffffffffffd8;
  undefined6 in_stack_ffffffffffffffe0;
  undefined8 local_18 [3];
  
  bVar1 = in_R8B & 1;
  this_00 = in_RDI;
  local_18[0] = in_RDX;
  local_40 = getTree((LiteralSubstitutionTree<Inferences::ALASCA::BinaryResolutionConf::Lhs> *)
                     (CONCAT17(in_CL,CONCAT16(in_R8B,in_stack_ffffffffffffffe0)) & 0x101ffffffffffff
                     ),in_stack_ffffffffffffffd8,in_stack_ffffffffffffffd7);
  local_38 = local_18[0];
  local_30 = bVar1 & 1;
  bVar2 = SubstitutionTree<Inferences::ALASCA::BinaryResolutionConf::Lhs>::isEmpty(this_00);
  Lib::
  ifElseIter<bool,Indexing::LiteralSubstitutionTree<Inferences::ALASCA::BinaryResolutionConf::Lhs>::getResultIterator<Indexing::SubstitutionTree<Inferences::ALASCA::BinaryResolutionConf::Lhs>::FastInstancesIterator>(Kernel::Literal*,bool,bool)::_lambda()_1_,Indexing::LiteralSubstitutionTree<Inferences::ALASCA::BinaryResolutionConf::Lhs>::getResultIterator<Indexing::SubstitutionTree<Inferences::ALASCA::BinaryResolutionConf::Lhs>::FastInstancesIterator>(Kernel::Literal*,bool,bool)::_lambda()_2_>
            (in_RDI,bVar2,local_18,&local_40);
  return (IterTraits<Lib::CoproductIter<Lib::VirtualIterator<Indexing::QueryRes<Lib::SmartPtr<Indexing::ResultSubstitution>,_Inferences::ALASCA::BinaryResolutionConf::Lhs>_>,_Lib::IterTraits<Lib::CoproductIter<Lib::VirtualIterator<Indexing::QueryRes<Lib::SmartPtr<Indexing::ResultSubstitution>,_Inferences::ALASCA::BinaryResolutionConf::Lhs>_>,_Lib::IterTraits<Lib::CatIterator<Lib::VirtualIterator<Indexing::QueryRes<Lib::SmartPtr<Indexing::ResultSubstitution>,_Inferences::ALASCA::BinaryResolutionConf::Lhs>_>,_Lib::IterTraits<Lib::VirtualIterator<Indexing::QueryRes<Lib::SmartPtr<Indexing::ResultSubstitution>,_Inferences::ALASCA::BinaryResolutionConf::Lhs>_>_>_>_>_>_>_>_>
          *)this_00;
}

Assistant:

auto getResultIterator(Literal* lit, bool complementary, bool retrieveSubstitutions, Args... args)
  {
    auto tree = &getTree(lit, complementary);

    auto iter = [tree, lit, retrieveSubstitutions, &args...](bool reversed) 
      { return tree->template iterator<Iterator>(lit, retrieveSubstitutions, reversed, args...); };

    return ifElseIter(
        tree->isEmpty(), [&]() { return VirtualIterator<ELEMENT_TYPE(Iterator)>::getEmpty(); },
                         [&]() { return ifElseIter(!lit->isEquality(),
                                 [&]() { return iter(/* reverse */ false); },
                                 [&]() { return concatIters(iter(/* reverse */ false), iter(/* reverse */ true)); }); }
        );
  }